

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_force_ip.cc
# Opt level: O1

int runForceIP(string *command,int argc,char **argv)

{
  bool bVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  uint3 uVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [13];
  undefined1 auVar17 [15];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [13];
  char cVar21;
  int iVar22;
  array<unsigned_char,_4UL> aVar23;
  array<unsigned_char,_4UL> aVar24;
  array<unsigned_char,_4UL> aVar25;
  int iVar26;
  undefined8 uVar27;
  ostream *poVar28;
  long lVar29;
  char *pcVar30;
  pointer pDVar31;
  int iVar32;
  uint uVar33;
  uint uVar35;
  ulong uVar34;
  byte bVar36;
  string p;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  string local_f8;
  int local_d4;
  string *local_d0;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_c8;
  ulong local_b0;
  undefined1 local_a8 [24];
  undefined1 auStack_90 [24];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  pointer local_38;
  
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  auStack_90._8_16_ = (undefined1  [16])0x0;
  stack0xffffffffffffff68 = (undefined1  [16])0x0;
  local_a8._0_16_ = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  iVar26 = 0;
  local_b0 = 0;
  local_d0 = command;
  do {
    if (argc <= iVar26) goto LAB_0011179c;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,argv[iVar26],(allocator<char> *)&local_c8);
    iVar32 = iVar26 + 1;
    uVar27 = std::__cxx11::string::compare((char *)&local_f8);
    iVar22 = 0;
    if ((int)uVar27 == 0) {
      local_b0 = CONCAT71((int7)((ulong)uVar27 >> 8),1);
      iVar26 = iVar32;
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)&local_f8);
      if (iVar22 == 0) {
        iVar26 = parseFilterArguments(argc - iVar32,argv + iVar32,(DeviceFilter *)local_a8);
        iVar26 = iVar26 + iVar32;
        iVar22 = 0;
      }
      else {
        iVar22 = std::__cxx11::string::compare((char *)&local_f8);
        if ((iVar22 == 0) ||
           (iVar22 = std::__cxx11::string::compare((char *)&local_f8), iVar22 == 0)) {
          printHelp((ostream *)&std::cout,local_d0);
          local_d4 = 0;
          iVar22 = 1;
          iVar26 = iVar32;
        }
        else {
          iVar22 = 3;
          if ((local_f8._M_string_length != 0) && (*local_f8._M_dataplus._M_p == '-')) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid argument: ",0x12);
            poVar28 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,local_f8._M_dataplus._M_p,
                                 local_f8._M_string_length);
            local_c8.
            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
            _M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator<char>)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar28,(char *)&local_c8,1);
            printHelp((ostream *)&std::cerr,local_d0);
            local_d4 = 1;
            iVar26 = iVar32;
            iVar22 = 1;
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
  } while (iVar22 == 0);
  iVar32 = local_d4;
  if (iVar22 != 3) goto LAB_00111c3b;
LAB_0011179c:
  if (local_78._0_8_ == local_78._8_8_) {
    if (local_a8._0_8_ != local_a8._8_8_) goto LAB_001117ca;
    if (auStack_90._0_8_ != auStack_90._8_8_) goto LAB_001117ca;
    lVar29 = 0xd;
    pcVar30 = "No filter set";
  }
  else {
LAB_001117ca:
    if (iVar26 + 3 == argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,argv[iVar26],(allocator<char> *)&local_c8);
      aVar23 = string2byte<4u>(&local_f8,10,'.');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,argv[(long)iVar26 + 1],(allocator<char> *)&local_c8);
      aVar24 = string2byte<4u>(&local_f8,10,'.');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,argv[(long)iVar26 + 2],(allocator<char> *)&local_c8);
      aVar25 = string2byte<4u>(&local_f8,10,'.');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      discoverWithFilter(&local_c8,(DeviceFilter *)local_a8);
      if ((pointer)CONCAT71(local_c8.
                            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_c8.
                            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_1_) ==
          local_c8.
          super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar29 = 0xf;
        pcVar30 = "No device found";
LAB_00111bf4:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar30,lVar29);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        iVar32 = 0;
        std::ostream::flush();
      }
      else {
        if ((ulong)((long)local_c8.
                          super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)CONCAT71(local_c8.
                                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_c8.
                                  super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)) < 0x101) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Setting the IP address of the following device:\n",0x30)
          ;
          printDeviceTable((ostream *)&std::cout,&local_c8,true,false,false);
          if ((local_b0 & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Are you sure? [y/N] ",0x14);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            local_f8._M_string_length = 0;
            local_f8.field_2._M_local_buf[0] = '\0';
            cVar21 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x78);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)&local_f8,cVar21);
            iVar26 = std::__cxx11::string::compare((char *)&local_f8);
            bVar1 = true;
            if ((iVar26 != 0) &&
               (iVar26 = std::__cxx11::string::compare((char *)&local_f8), iVar26 != 0)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cancel",6);
              bVar1 = false;
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              local_d4 = 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,
                              CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                       local_f8.field_2._M_local_buf[0]) + 1);
            }
            iVar32 = local_d4;
            if (!bVar1) goto LAB_00111c31;
          }
          pDVar31 = (pointer)CONCAT71(local_c8.
                                      super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      local_c8.
                                      super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
          lVar29 = 4;
          pcVar30 = "Done";
          if (pDVar31 !=
              local_c8.
              super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            uVar13 = (ulong)aVar23._M_elems._0_2_ & 0xffffffffffff00ff;
            auVar2._8_4_ = 0;
            auVar2._0_8_ = uVar13;
            auVar2[0xc] = aVar23._M_elems[3];
            auVar3[8] = aVar23._M_elems[2];
            auVar3._0_8_ = uVar13;
            auVar3[9] = 0;
            auVar3._10_3_ = auVar2._10_3_;
            auVar16._5_8_ = 0;
            auVar16._0_5_ = auVar3._8_5_;
            auVar4[4] = aVar23._M_elems[1];
            auVar4._0_4_ = (int)uVar13;
            auVar4[5] = 0;
            auVar4._6_7_ = SUB137(auVar16 << 0x40,6);
            uVar5 = auVar2._10_3_ >> 0x10;
            auVar17._12_3_ = uVar5;
            auVar17._0_12_ = ZEXT312(uVar5) << 0x40;
            iVar26 = (int)DAT_00119360;
            uVar33 = DAT_00119360._8_4_;
            iVar32 = DAT_00119360._4_4_;
            uVar35 = DAT_00119360._12_4_;
            uVar14 = (ulong)aVar24._M_elems._0_2_ & 0xffffffffffff00ff;
            auVar6._8_4_ = 0;
            auVar6._0_8_ = uVar14;
            auVar6[0xc] = aVar24._M_elems[3];
            auVar7[8] = aVar24._M_elems[2];
            auVar7._0_8_ = uVar14;
            auVar7[9] = 0;
            auVar7._10_3_ = auVar6._10_3_;
            auVar18._5_8_ = 0;
            auVar18._0_5_ = auVar7._8_5_;
            auVar8[4] = aVar24._M_elems[1];
            auVar8._0_4_ = (int)uVar14;
            auVar8[5] = 0;
            auVar8._6_7_ = SUB137(auVar18 << 0x40,6);
            uVar5 = auVar6._10_3_ >> 0x10;
            auVar19._12_3_ = uVar5;
            auVar19._0_12_ = ZEXT312(uVar5) << 0x40;
            bVar36 = aVar25._M_elems[3];
            uVar15 = (ulong)aVar25._M_elems._0_2_ & 0xffffffffffff00ff;
            auVar9._8_4_ = 0;
            auVar9._0_8_ = uVar15;
            auVar9[0xc] = bVar36;
            auVar10[8] = aVar25._M_elems[2];
            auVar10._0_8_ = uVar15;
            auVar10[9] = 0;
            auVar10._10_3_ = auVar9._10_3_;
            auVar20._5_8_ = 0;
            auVar20._0_5_ = auVar10._8_5_;
            auVar11[4] = aVar25._M_elems[1];
            auVar11._0_4_ = (int)uVar15;
            auVar11[5] = 0;
            auVar11._6_7_ = SUB137(auVar20 << 0x40,6);
            uVar34 = DAT_00119360._8_8_;
            auVar12[0xc] = bVar36;
            auVar12._0_12_ = ZEXT112(bVar36) << 0x40;
            do {
              rcdiscover::ForceIP::ForceIP((ForceIP *)&local_f8);
              rcdiscover::ForceIP::sendCommand
                        ((ForceIP *)&local_f8,pDVar31->mac,
                         (uint)(((ulong)auVar17._8_7_ & 0xffffffff) * (ulong)uVar35) |
                         auVar4._4_4_ * iVar32 |
                         (uint)(((ulong)auVar3._8_5_ & 0xffffffff) * (ulong)uVar33) |
                         (int)uVar13 * iVar26,
                         (uint)(((ulong)auVar19._8_7_ & 0xffffffff) * (ulong)uVar35) |
                         auVar8._4_4_ * iVar32 |
                         (uint)(((ulong)auVar7._8_5_ & 0xffffffff) * (ulong)uVar33) |
                         (int)uVar14 * iVar26,
                         (uint)(((ulong)auVar12._8_5_ & 0xffffffff) * (ulong)uVar35) |
                         auVar11._4_4_ * iVar32 |
                         (uint)((uVar34 & 0xffffffff) * ((ulong)auVar10._8_5_ & 0xffffffff)) |
                         iVar26 * (int)uVar15);
              std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::
              ~vector((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                      &local_f8);
              pDVar31 = pDVar31 + 1;
            } while (pDVar31 !=
                     local_c8.
                     super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
            lVar29 = 4;
            pcVar30 = "Done";
          }
          goto LAB_00111bf4;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found more than one device matching the filter criteria.",
                   0x38);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
        printDeviceTable((ostream *)&std::cout,&local_c8,true,false,false);
        iVar32 = 0;
      }
LAB_00111c31:
      std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
                (&local_c8);
      goto LAB_00111c3b;
    }
    lVar29 = 0x37;
    pcVar30 = "IP address, subnet mask and default gateway must be set";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar30,lVar29);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  printHelp((ostream *)&std::cerr,local_d0);
  iVar32 = 1;
LAB_00111c3b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_68 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
  return iVar32;
}

Assistant:

int runForceIP(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  int i = 0;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else if (!p.empty() && p[0] == '-')
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
    else
    {
      --i;
      break;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  if (i + 3 != argc)
  {
    std::cerr << "IP address, subnet mask and default gateway must be set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  std::array<uint8_t, 4> ip;
  std::array<uint8_t, 4> mask;
  std::array<uint8_t, 4> gateway;

  try
  {
    ip = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse IP address" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  try
  {
    mask = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse subnet mask" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  try
  {
    gateway = string2ip(argv[i++]);
  }
  catch (const std::exception &)
  {
    std::cerr << "Cannot parse default gateway" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  if (devices.size() > 1)
  {
    std::cout << "Found more than one device matching the filter criteria." << std::endl;
    printDeviceTable(std::cout, devices, true, false, false);
    return 0;
  }

  std::cout << "Setting the IP address of the following device:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::ForceIP force_ip;
    force_ip.sendCommand(device.getMAC(),
                         byteArrayToInt(ip),
                         byteArrayToInt(mask),
                         byteArrayToInt(gateway));
  }

  std::cout << "Done" << std::endl;

  return 0;
}